

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O2

void jinit_d_main_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  jpeg_error_mgr *pjVar1;
  jpeg_d_main_controller *pjVar2;
  jpeg_d_main_controller *pjVar3;
  _func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *p_Var4;
  void *pvVar5;
  JSAMPARRAY ppJVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  pjVar3 = (jpeg_d_main_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x88);
  cinfo->main = pjVar3;
  pjVar3->start_pass = start_pass_main;
  if (need_full_buffer != 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 3;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  iVar10 = cinfo->min_DCT_v_scaled_size;
  if (cinfo->upsample->need_context_rows != 0) {
    if (iVar10 < 2) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x30;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
      iVar10 = cinfo->min_DCT_v_scaled_size;
    }
    pjVar2 = cinfo->main;
    p_Var4 = (_func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *)
             (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 4);
    pjVar2[6].process_data = p_Var4;
    uVar7 = (ulong)cinfo->num_components;
    pjVar2[7].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)(p_Var4 + uVar7 * 8);
    piVar8 = &cinfo->comp_info->DCT_v_scaled_size;
    for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
      iVar12 = (*piVar8 * piVar8[-7]) / cinfo->min_DCT_v_scaled_size;
      iVar9 = iVar12 * (iVar10 + 4);
      pvVar5 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)(iVar9 * 2) << 3);
      pvVar5 = (void *)((long)pvVar5 + (long)iVar12 * 8);
      *(void **)(pjVar2[6].process_data + lVar11 * 8) = pvVar5;
      *(void **)(pjVar2[7].start_pass + lVar11 * 8) = (void *)((long)pvVar5 + (long)iVar9 * 8);
      uVar7 = (ulong)(uint)cinfo->num_components;
      piVar8 = piVar8 + 0x18;
    }
    iVar10 = cinfo->min_DCT_v_scaled_size + 2;
  }
  piVar8 = &cinfo->comp_info->DCT_v_scaled_size;
  for (lVar11 = 0; lVar11 < cinfo->num_components; lVar11 = lVar11 + 1) {
    ppJVar6 = (*cinfo->mem->alloc_sarray)
                        ((j_common_ptr)cinfo,1,piVar8[-1] * piVar8[-3],
                         ((*piVar8 * piVar8[-7]) / cinfo->min_DCT_v_scaled_size) * iVar10);
    (&pjVar3[1].start_pass)[lVar11] = (_func_void_j_decompress_ptr_J_BUF_MODE *)ppJVar6;
    piVar8 = piVar8 + 0x18;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_d_main_controller (j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main;
  int ci, rgroup, ngroups;
  jpeg_component_info *compptr;

  main = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_main_controller));
  cinfo->main = (struct jpeg_d_main_controller *) main;
  main->pub.start_pass = start_pass_main;

  if (need_full_buffer)		/* shouldn't happen */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  /* Allocate the workspace.
   * ngroups is the number of row groups we need.
   */
  if (cinfo->upsample->need_context_rows) {
    if (cinfo->min_DCT_v_scaled_size < 2) /* unsupported, see comments above */
      ERREXIT(cinfo, JERR_NOTIMPL);
    alloc_funny_pointers(cinfo); /* Alloc space for xbuffer[] lists */
    ngroups = cinfo->min_DCT_v_scaled_size + 2;
  } else {
    ngroups = cinfo->min_DCT_v_scaled_size;
  }

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
      cinfo->min_DCT_v_scaled_size; /* height of a row group of component */
    main->buffer[ci] = (*cinfo->mem->alloc_sarray)
			((j_common_ptr) cinfo, JPOOL_IMAGE,
			 compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			 (JDIMENSION) (rgroup * ngroups));
  }
}